

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sshpubk.c
# Opt level: O2

ptrlen pubkey_blob_to_alg_name(ptrlen blob)

{
  ptrlen pVar1;
  BinarySource src [1];
  BinarySource local_28;
  
  local_28.len = blob.len;
  local_28.data = blob.ptr;
  local_28.binarysource_ = &local_28;
  local_28.pos = 0;
  local_28.err = BSE_NO_ERROR;
  pVar1 = BinarySource_get_string(&local_28);
  return pVar1;
}

Assistant:

ptrlen pubkey_blob_to_alg_name(ptrlen blob)
{
    BinarySource src[1];
    BinarySource_BARE_INIT_PL(src, blob);
    return get_string(src);
}